

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_std_formatting.cpp
# Opt level: O0

bool equal<wchar_t,wchar_t>
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s1,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s2)

{
  __type _Var1;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_ffffffffffffff58;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  string local_30 [48];
  
  __rhs = &local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"UTF-8",__rhs);
  booster::locale::conv::from_utf<wchar_t>
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,(method_type)((ulong)__rhs >> 0x20)
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff58,"UTF-8",(allocator *)&stack0xffffffffffffff57);
  booster::locale::conv::from_utf<wchar_t>
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,(method_type)((ulong)__rhs >> 0x20)
            );
  _Var1 = std::operator==(in_stack_ffffffffffffff50,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs
                         );
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return _Var1;
}

Assistant:

bool equal(std::basic_string<C1> const &s1,std::basic_string<C2> const &s2)
{
    return booster::locale::conv::from_utf(s1,"UTF-8") == booster::locale::conv::from_utf(s2,"UTF-8");
}